

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O0

void __thiscall capnp::Schema::requireUsableAs(Schema *this,RawSchema *expected)

{
  bool bVar1;
  Fault local_20;
  Fault f;
  RawSchema *expected_local;
  Schema *this_local;
  
  bVar1 = true;
  if ((this->raw->generic != expected) && (bVar1 = false, expected != (RawSchema *)0x0)) {
    bVar1 = this->raw->generic->canCastTo == expected;
  }
  if (bVar1) {
    return;
  }
  f.exception = (Exception *)expected;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[62]>
            (&local_20,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema.c++"
             ,0x133,FAILED,
             "raw->generic == expected || (expected != nullptr && raw->generic->canCastTo == expected)"
             ,"\"This schema is not compatible with the requested native type.\"",
             (char (*) [62])"This schema is not compatible with the requested native type.");
  kj::_::Debug::Fault::fatal(&local_20);
}

Assistant:

void Schema::requireUsableAs(const _::RawSchema* expected) const {
  KJ_REQUIRE(raw->generic == expected ||
             (expected != nullptr && raw->generic->canCastTo == expected),
             "This schema is not compatible with the requested native type.");
}